

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_coletree.c
# Opt level: O2

int * mxCallocInt(int n)

{
  int *piVar1;
  ulong uVar2;
  ulong uVar3;
  char msg [256];
  
  piVar1 = (int *)superlu_malloc((long)n << 2);
  if (piVar1 == (int *)0x0) {
    sprintf(msg,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for buf in mxCallocInt()",0x44,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sp_coletree.c"
           );
    superlu_abort_and_exit(msg);
  }
  uVar2 = 0;
  uVar3 = (ulong)(uint)n;
  if (n < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    piVar1[uVar2] = 0;
  }
  return piVar1;
}

Assistant:

static 
int *mxCallocInt(int n)
{
    register int i;
    int *buf;

    buf = (int *) SUPERLU_MALLOC( n * sizeof(int) );
    if ( !buf ) {
         ABORT("SUPERLU_MALLOC fails for buf in mxCallocInt()");
       }
    for (i = 0; i < n; i++) buf[i] = 0;
    return (buf);
}